

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O2

char * __thiscall cmState::GetCacheEntryProperty(cmState *this,string *key,string *propertyName)

{
  bool bVar1;
  char *pcVar2;
  CacheIterator it;
  CacheIterator local_18;
  
  local_18 = cmCacheManager::GetCacheIterator
                       ((this->CacheManager)._M_t.
                        super___uniq_ptr_impl<cmCacheManager,_std::default_delete<cmCacheManager>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_cmCacheManager_*,_std::default_delete<cmCacheManager>_>
                        .super__Head_base<0UL,_cmCacheManager_*,_false>._M_head_impl,
                        (key->_M_dataplus)._M_p);
  bVar1 = cmCacheManager::CacheIterator::PropertyExists(&local_18,propertyName);
  if (bVar1) {
    pcVar2 = cmCacheManager::CacheIterator::GetProperty(&local_18,propertyName);
  }
  else {
    pcVar2 = (char *)0x0;
  }
  return pcVar2;
}

Assistant:

const char* cmState::GetCacheEntryProperty(std::string const& key,
                                           std::string const& propertyName)
{
  cmCacheManager::CacheIterator it =
    this->CacheManager->GetCacheIterator(key.c_str());
  if (!it.PropertyExists(propertyName)) {
    return nullptr;
  }
  return it.GetProperty(propertyName);
}